

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl)

{
  byte bVar1;
  int iVar2;
  u64 local_28;
  i64 iVal;
  Fts5Data *pFStack_18;
  int iOff;
  Fts5Data *pData;
  Fts5DlidxLvl *pLvl_local;
  
  pFStack_18 = pLvl->pData;
  pData = (Fts5Data *)pLvl;
  if (pLvl->iOff == 0) {
    pLvl->iOff = 1;
    iVar2 = sqlite3Fts5GetVarint32(pFStack_18->p + 1,(u32 *)&pLvl->iLeafPgno);
    pData->nn = iVar2 + pData->nn;
    bVar1 = sqlite3Fts5GetVarint(pFStack_18->p + pData->nn,(u64 *)&pData[1].nn);
    pData->nn = (uint)bVar1 + pData->nn;
    *(int *)&pData[1].p = pData->nn;
  }
  else {
    for (iVal._4_4_ = pLvl->iOff;
        (iVal._4_4_ < pFStack_18->nn && (pFStack_18->p[iVal._4_4_] == '\0'));
        iVal._4_4_ = iVal._4_4_ + 1) {
    }
    if (iVal._4_4_ < pFStack_18->nn) {
      pLvl->iLeafPgno = (iVal._4_4_ - pLvl->iOff) + 1 + pLvl->iLeafPgno;
      bVar1 = sqlite3Fts5GetVarint(pFStack_18->p + iVal._4_4_,&local_28);
      *(u64 *)&pData[1].nn = local_28 + *(long *)&pData[1].nn;
      pData->nn = (uint)bVar1 + iVal._4_4_;
    }
    else {
      pLvl->bEof = 1;
    }
  }
  return pData->szLeaf;
}

Assistant:

static int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl){
  Fts5Data *pData = pLvl->pData;

  if( pLvl->iOff==0 ){
    assert( pLvl->bEof==0 );
    pLvl->iOff = 1;
    pLvl->iOff += fts5GetVarint32(&pData->p[1], pLvl->iLeafPgno);
    pLvl->iOff += fts5GetVarint(&pData->p[pLvl->iOff], (u64*)&pLvl->iRowid);
    pLvl->iFirstOff = pLvl->iOff;
  }else{
    int iOff;
    for(iOff=pLvl->iOff; iOff<pData->nn; iOff++){
      if( pData->p[iOff] ) break; 
    }

    if( iOff<pData->nn ){
      i64 iVal;
      pLvl->iLeafPgno += (iOff - pLvl->iOff) + 1;
      iOff += fts5GetVarint(&pData->p[iOff], (u64*)&iVal);
      pLvl->iRowid += iVal;
      pLvl->iOff = iOff;
    }else{
      pLvl->bEof = 1;
    }
  }

  return pLvl->bEof;
}